

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int dnscache_entry_is_stale(void *datap,void *hc)

{
  long lVar1;
  
  if (*(long *)((long)hc + 8) != 0) {
    lVar1 = *datap - *(long *)((long)hc + 8);
    if (*(int *)((long)datap + 0x10) <= lVar1) {
      return 1;
    }
    if (*(long *)((long)datap + 8) < lVar1) {
      *(long *)((long)datap + 8) = lVar1;
    }
  }
  return 0;
}

Assistant:

static int
dnscache_entry_is_stale(void *datap, void *hc)
{
  struct dnscache_prune_data *prune =
    (struct dnscache_prune_data *) datap;
  struct Curl_dns_entry *dns = (struct Curl_dns_entry *) hc;

  if(dns->timestamp) {
    /* age in seconds */
    time_t age = prune->now - dns->timestamp;
    if(age >= (time_t)prune->max_age_sec)
      return TRUE;
    if(age > prune->oldest)
      prune->oldest = age;
  }
  return FALSE;
}